

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O2

void __thiscall cali::MemoryPool::MemoryPoolImpl::~MemoryPoolImpl(MemoryPoolImpl *this)

{
  pointer pCVar1;
  Chunk *c;
  pointer pCVar2;
  
  pCVar1 = (this->m_chunks).
           super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->m_chunks).
                super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    if (pCVar2->ptr != (uchar *)0x0) {
      operator_delete__(pCVar2->ptr);
    }
  }
  pCVar2 = (this->m_chunks).
           super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_chunks).
      super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (this->m_chunks).
    super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  std::
  _Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
  ::~_Vector_base(&(this->m_chunks).
                   super__Vector_base<cali::MemoryPool::MemoryPoolImpl::Chunk,_std::allocator<cali::MemoryPool::MemoryPoolImpl::Chunk>_>
                 );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_config).mP.
              super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~MemoryPoolImpl()
    {
        for (auto& c : m_chunks)
            delete[] c.ptr;

        m_chunks.clear();
    }